

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int io_seek(IOHANDLE io,int offset,int origin)

{
  int iVar1;
  
  if ((uint)origin < 3) {
    iVar1 = fseek((FILE *)io,(long)offset,origin);
    return iVar1;
  }
  return -1;
}

Assistant:

int io_seek(IOHANDLE io, int offset, int origin)
{
	int real_origin;

	switch(origin)
	{
	case IOSEEK_START:
		real_origin = SEEK_SET;
		break;
	case IOSEEK_CUR:
		real_origin = SEEK_CUR;
		break;
	case IOSEEK_END:
		real_origin = SEEK_END;
		break;
	default:
		return -1;
	}

	return fseek((FILE*)io, offset, real_origin);
}